

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxWhileLoop::Emit(FxWhileLoop *this,VMFunctionBuilder *build)

{
  bool bVar1;
  int iVar2;
  size_t target;
  size_t sVar3;
  ExpEmit EVar4;
  TArray<unsigned_long,_unsigned_long> no;
  TArray<unsigned_long,_unsigned_long> yes;
  ExpVal local_28;
  
  if (this->Condition->ValueType != (PType *)TypeBool) {
    __assert_fail("Condition->ValueType == TypeBool",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x237c,"virtual ExpEmit FxWhileLoop::Emit(VMFunctionBuilder *)");
  }
  yes.Array = (unsigned_long *)0x0;
  yes.Most = 0;
  yes.Count = 0;
  no.Array = (unsigned_long *)0x0;
  no.Most = 0;
  no.Count = 0;
  target = VMFunctionBuilder::GetAddress(build);
  iVar2 = (*this->Condition->_vptr_FxExpression[3])();
  if ((char)iVar2 == '\0') {
    (*this->Condition->_vptr_FxExpression[10])(this->Condition,build,0,&yes,&no);
  }
  else {
    ExpVal::ExpVal(&local_28,(ExpVal *)(this->Condition + 1));
    bVar1 = ExpVal::GetBool(&local_28);
    if (!bVar1) {
      __assert_fail("static_cast<FxConstant *>(Condition)->GetValue().GetBool() == true",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x2387,"virtual ExpEmit FxWhileLoop::Emit(VMFunctionBuilder *)");
    }
    ExpVal::~ExpVal(&local_28);
  }
  VMFunctionBuilder::BackpatchListToHere(build,&yes);
  if (this->Code != (FxExpression *)0x0) {
    FxExpression::EmitStatement(this->Code,build);
  }
  sVar3 = VMFunctionBuilder::Emit(build,0x44,0);
  VMFunctionBuilder::Backpatch(build,sVar3,target);
  VMFunctionBuilder::BackpatchListToHere(build,&no);
  sVar3 = VMFunctionBuilder::GetAddress(build);
  FxLoopStatement::Backpatch(&this->super_FxLoopStatement,build,target,sVar3);
  TArray<unsigned_long,_unsigned_long>::~TArray(&no);
  TArray<unsigned_long,_unsigned_long>::~TArray(&yes);
  EVar4.RegNum = 0;
  EVar4.RegType = 0x80;
  EVar4.RegCount = '\x01';
  EVar4.Konst = false;
  EVar4.Fixed = false;
  EVar4.Final = false;
  EVar4.Target = false;
  return EVar4;
}

Assistant:

ExpEmit FxWhileLoop::Emit(VMFunctionBuilder *build)
{
	assert(Condition->ValueType == TypeBool);

	size_t loopstart, loopend;
	TArray<size_t> yes, no;

	// Evaluate the condition and execute/break out of the loop.
	loopstart = build->GetAddress();
	if (!Condition->isConstant())
	{
		Condition->EmitCompare(build, false, yes, no);
	}
	else assert(static_cast<FxConstant *>(Condition)->GetValue().GetBool() == true);

	build->BackpatchListToHere(yes);
	// Execute the loop's content.
	if (Code != nullptr)
	{
		Code->EmitStatement(build);
	}

	// Loop back.
	build->Backpatch(build->Emit(OP_JMP, 0), loopstart);
	build->BackpatchListToHere(no);
	loopend = build->GetAddress();
	Backpatch(build, loopstart, loopend);
	return ExpEmit();
}